

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::sse2::DiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  byte bVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  undefined4 uVar23;
  ulong uVar24;
  RTCFilterFunctionN p_Var25;
  RTCRayN *pRVar26;
  long lVar27;
  Scene *pSVar28;
  long lVar29;
  float fVar30;
  float fVar36;
  float fVar38;
  float fVar40;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar37;
  uint uVar39;
  uint uVar41;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar35;
  float fVar42;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar53;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar60 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  vbool<4> valid;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  RayQueryContext *local_198;
  Scene *local_190;
  RTCFilterFunctionNArguments args;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118 [4];
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [4];
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar28 = context->scene;
  local_d8[0] = Disc->sharedGeomID;
  pGVar10 = (pSVar28->geometries).items[local_d8[0]].ptr;
  lVar27 = *(long *)&pGVar10->field_0x58;
  _Var11 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar27 + (Disc->primIDs).field_0.i[0] * _Var11);
  pfVar2 = (float *)(lVar27 + (Disc->primIDs).field_0.i[1] * _Var11);
  pfVar3 = (float *)(lVar27 + (Disc->primIDs).field_0.i[2] * _Var11);
  pfVar4 = (float *)(lVar27 + (Disc->primIDs).field_0.i[3] * _Var11);
  bVar9 = Disc->numPrimitives;
  local_d8[1] = local_d8[0];
  local_d8[2] = local_d8[0];
  local_d8[3] = local_d8[0];
  fVar58 = *(float *)(ray + k * 4);
  fVar52 = *(float *)(ray + k * 4 + 0x10);
  fVar63 = *(float *)(ray + k * 4 + 0x20);
  fVar30 = *(float *)(ray + k * 4 + 0x30);
  fVar53 = *pfVar1 - fVar58;
  fVar56 = *pfVar2 - fVar58;
  fVar57 = *pfVar3 - fVar58;
  fVar58 = *pfVar4 - fVar58;
  fVar42 = pfVar1[1] - fVar52;
  fVar50 = pfVar2[1] - fVar52;
  fVar51 = pfVar3[1] - fVar52;
  fVar52 = pfVar4[1] - fVar52;
  fVar59 = pfVar1[2] - fVar63;
  fVar61 = pfVar2[2] - fVar63;
  fVar62 = pfVar3[2] - fVar63;
  fVar63 = pfVar4[2] - fVar63;
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  fVar6 = *(float *)(ray + k * 4 + 0x50);
  fVar7 = *(float *)(ray + k * 4 + 0x60);
  fVar77 = fVar6 * fVar6 + fVar7 * fVar7;
  fVar76 = fVar5 * fVar5 + fVar77;
  auVar78._4_4_ = fVar76;
  auVar78._0_4_ = fVar76;
  auVar78._8_4_ = fVar76;
  auVar78._12_4_ = fVar76;
  auVar78 = rcpps(ZEXT416((uint)fVar77),auVar78);
  fVar77 = auVar78._0_4_;
  fVar79 = auVar78._4_4_;
  fVar80 = auVar78._8_4_;
  fVar81 = auVar78._12_4_;
  fVar77 = (fVar53 * fVar5 + fVar42 * fVar6 + fVar59 * fVar7) *
           ((1.0 - fVar76 * fVar77) * fVar77 + fVar77);
  fVar79 = (fVar56 * fVar5 + fVar50 * fVar6 + fVar61 * fVar7) *
           ((1.0 - fVar76 * fVar79) * fVar79 + fVar79);
  fVar80 = (fVar57 * fVar5 + fVar51 * fVar6 + fVar62 * fVar7) *
           ((1.0 - fVar76 * fVar80) * fVar80 + fVar80);
  fVar81 = (fVar58 * fVar5 + fVar52 * fVar6 + fVar63 * fVar7) *
           ((1.0 - fVar76 * fVar81) * fVar81 + fVar81);
  fVar76 = *(float *)(ray + k * 4 + 0x80);
  bVar17 = (fVar77 <= fVar76 && fVar30 <= fVar77) && bVar9 != 0;
  bVar18 = (fVar79 <= fVar76 && fVar30 <= fVar79) && 1 < bVar9;
  bVar19 = (fVar80 <= fVar76 && fVar30 <= fVar80) && 2 < bVar9;
  bVar20 = (fVar81 <= fVar76 && fVar30 <= fVar81) && 3 < bVar9;
  auVar16._4_4_ = -(uint)bVar18;
  auVar16._0_4_ = -(uint)bVar17;
  auVar16._8_4_ = -(uint)bVar19;
  auVar16._12_4_ = -(uint)bVar20;
  iVar21 = movmskps(local_d8[0],auVar16);
  if (iVar21 != 0) {
    fVar64 = fVar53 - fVar5 * fVar77;
    fVar65 = fVar56 - fVar5 * fVar79;
    fVar66 = fVar57 - fVar5 * fVar80;
    fVar67 = fVar58 - fVar5 * fVar81;
    fVar68 = fVar42 - fVar6 * fVar77;
    fVar69 = fVar50 - fVar6 * fVar79;
    fVar70 = fVar51 - fVar6 * fVar80;
    fVar71 = fVar52 - fVar6 * fVar81;
    fVar72 = fVar59 - fVar7 * fVar77;
    fVar73 = fVar61 - fVar7 * fVar79;
    fVar74 = fVar62 - fVar7 * fVar80;
    fVar75 = fVar63 - fVar7 * fVar81;
    fVar30 = pfVar1[3] * pfVar1[3];
    fVar36 = pfVar2[3] * pfVar2[3];
    fVar38 = pfVar3[3] * pfVar3[3];
    fVar40 = pfVar4[3] * pfVar4[3];
    bVar17 = fVar64 * fVar64 + fVar68 * fVar68 + fVar72 * fVar72 <= fVar30 && bVar17;
    bVar18 = fVar65 * fVar65 + fVar69 * fVar69 + fVar73 * fVar73 <= fVar36 && bVar18;
    bVar19 = fVar66 * fVar66 + fVar70 * fVar70 + fVar74 * fVar74 <= fVar38 && bVar19;
    bVar20 = fVar67 * fVar67 + fVar71 * fVar71 + fVar75 * fVar75 <= fVar40 && bVar20;
    auVar12._4_4_ = -(uint)bVar18;
    auVar12._0_4_ = -(uint)bVar17;
    auVar12._8_4_ = -(uint)bVar19;
    auVar12._12_4_ = -(uint)bVar20;
    iVar21 = movmskps(iVar21,auVar12);
    if (iVar21 != 0) {
      bVar17 = fVar30 < fVar53 * fVar53 + fVar42 * fVar42 + fVar59 * fVar59 && bVar17;
      valid.field_0.i[0] = -(uint)bVar17;
      bVar18 = fVar36 < fVar56 * fVar56 + fVar50 * fVar50 + fVar61 * fVar61 && bVar18;
      valid.field_0.i[1] = -(uint)bVar18;
      bVar19 = fVar38 < fVar57 * fVar57 + fVar51 * fVar51 + fVar62 * fVar62 && bVar19;
      valid.field_0.i[2] = -(uint)bVar19;
      bVar20 = fVar40 < fVar58 * fVar58 + fVar52 * fVar52 + fVar63 * fVar63 && bVar20;
      valid.field_0.i[3] = -(uint)bVar20;
      auVar13._4_4_ = valid.field_0.i[1];
      auVar13._0_4_ = valid.field_0.i[0];
      auVar13._8_4_ = valid.field_0.i[2];
      auVar13._12_4_ = valid.field_0.i[3];
      iVar21 = movmskps(iVar21,auVar13);
      if (iVar21 != 0) {
        local_128 = 0;
        uStack_120 = 0;
        local_138 = 0;
        uStack_130 = 0;
        local_118[0] = fVar77;
        local_118[1] = fVar79;
        local_118[2] = fVar80;
        local_118[3] = fVar81;
        local_108[0] = -fVar5;
        local_108[1] = -fVar5;
        local_108[2] = -fVar5;
        local_108[3] = -fVar5;
        local_f8[0] = -fVar6;
        local_f8[1] = -fVar6;
        local_f8[2] = -fVar6;
        local_f8[3] = -fVar6;
        local_e8[0] = -fVar7;
        local_e8[1] = -fVar7;
        local_e8[2] = -fVar7;
        local_e8[3] = -fVar7;
        auVar31._0_4_ = (uint)fVar77 & valid.field_0.i[0];
        auVar31._4_4_ = (uint)fVar79 & valid.field_0.i[1];
        auVar31._8_4_ = (uint)fVar80 & valid.field_0.i[2];
        auVar31._12_4_ = (uint)fVar81 & valid.field_0.i[3];
        auVar43._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
        auVar43._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
        auVar43._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
        auVar43 = auVar43 | auVar31;
        auVar54._4_4_ = auVar43._0_4_;
        auVar54._0_4_ = auVar43._4_4_;
        auVar54._8_4_ = auVar43._12_4_;
        auVar54._12_4_ = auVar43._8_4_;
        auVar78 = minps(auVar54,auVar43);
        auVar32._0_8_ = auVar78._8_8_;
        auVar32._8_4_ = auVar78._0_4_;
        auVar32._12_4_ = auVar78._4_4_;
        auVar78 = minps(auVar32,auVar78);
        auVar33._0_4_ = -(uint)(auVar78._0_4_ == auVar43._0_4_ && bVar17);
        auVar33._4_4_ = -(uint)(auVar78._4_4_ == auVar43._4_4_ && bVar18);
        auVar33._8_4_ = -(uint)(auVar78._8_4_ == auVar43._8_4_ && bVar19);
        auVar33._12_4_ = -(uint)(auVar78._12_4_ == auVar43._12_4_ && bVar20);
        iVar21 = movmskps(iVar21,auVar33);
        uVar22 = valid.field_0.i[0];
        uVar37 = valid.field_0.i[1];
        uVar39 = valid.field_0.i[2];
        uVar41 = valid.field_0.i[3];
        if (iVar21 != 0) {
          uVar22 = auVar33._0_4_;
          uVar37 = auVar33._4_4_;
          uVar39 = auVar33._8_4_;
          uVar41 = auVar33._12_4_;
        }
        auVar14._4_4_ = uVar37;
        auVar14._0_4_ = uVar22;
        auVar14._8_4_ = uVar39;
        auVar14._12_4_ = uVar41;
        uVar22 = movmskps(iVar21,auVar14);
        lVar27 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
        lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
        do {
          args.hit = (RTCHitN *)&local_c8;
          args.valid = &local_1a8;
          local_68 = local_d8[lVar27];
          uVar24 = (ulong)local_68;
          pGVar10 = (pSVar28->geometries).items[uVar24].ptr;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[lVar27] = 0.0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar23 = *(undefined4 *)((long)&local_138 + lVar27 * 4);
              uVar8 = *(undefined4 *)((long)&local_128 + lVar27 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_118[lVar27];
              *(float *)(ray + k * 4 + 0xc0) = local_108[lVar27];
              *(float *)(ray + k * 4 + 0xd0) = local_f8[lVar27];
              *(float *)(ray + k * 4 + 0xe0) = local_e8[lVar27];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar23;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar27];
              *(uint *)(ray + k * 4 + 0x120) = local_68;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_98 = *(undefined4 *)((long)&local_138 + lVar27 * 4);
            local_88 = *(undefined4 *)((long)&local_128 + lVar27 * 4);
            local_c8 = local_108[lVar27];
            local_b8 = local_f8[lVar27];
            local_78 = (Disc->primIDs).field_0.i[lVar27];
            local_a8 = local_e8[lVar27];
            fStack_c4 = local_c8;
            fStack_c0 = local_c8;
            fStack_bc = local_c8;
            fStack_b4 = local_b8;
            fStack_b0 = local_b8;
            fStack_ac = local_b8;
            fStack_a4 = local_a8;
            fStack_a0 = local_a8;
            fStack_9c = local_a8;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_84 = local_88;
            uStack_80 = local_88;
            uStack_7c = local_88;
            uStack_74 = local_78;
            uStack_70 = local_78;
            uStack_6c = local_78;
            uStack_64 = local_68;
            uStack_60 = local_68;
            uStack_5c = local_68;
            local_58 = context->user->instID[0];
            uStack_54 = local_58;
            uStack_50 = local_58;
            uStack_4c = local_58;
            local_48 = context->user->instPrimID[0];
            uStack_44 = local_48;
            uStack_40 = local_48;
            uStack_3c = local_48;
            *(float *)(ray + k * 4 + 0x80) = local_118[lVar27];
            local_1a8 = *(int *)(mm_lookupmask_ps + lVar29);
            iStack_1a4 = *(int *)(mm_lookupmask_ps + lVar29 + 4);
            iStack_1a0 = *(int *)(mm_lookupmask_ps + lVar29 + 8);
            iStack_19c = *(int *)(mm_lookupmask_ps + lVar29 + 0xc);
            args.geometryUserPtr = pGVar10->userPtr;
            args.context = context->user;
            args.N = 4;
            p_Var25 = pGVar10->intersectionFilterN;
            local_198 = context;
            args.ray = (RTCRayN *)ray;
            if (p_Var25 != (RTCFilterFunctionN)0x0) {
              local_190 = pSVar28;
              p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
              pSVar28 = local_190;
            }
            auVar44._0_4_ = -(uint)(local_1a8 == 0);
            auVar44._4_4_ = -(uint)(iStack_1a4 == 0);
            auVar44._8_4_ = -(uint)(iStack_1a0 == 0);
            auVar44._12_4_ = -(uint)(iStack_19c == 0);
            uVar22 = movmskps((int)p_Var25,auVar44);
            pRVar26 = (RTCRayN *)(ulong)(uVar22 ^ 0xf);
            if ((uVar22 ^ 0xf) == 0) {
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar45 = auVar44 ^ auVar15;
              context = local_198;
            }
            else {
              p_Var25 = local_198->args->filter;
              if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                 (((local_198->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
              }
              auVar34._0_4_ = -(uint)(local_1a8 == 0);
              auVar34._4_4_ = -(uint)(iStack_1a4 == 0);
              auVar34._8_4_ = -(uint)(iStack_1a0 == 0);
              auVar34._12_4_ = -(uint)(iStack_19c == 0);
              auVar45._8_4_ = 0xffffffff;
              auVar45._0_8_ = 0xffffffffffffffff;
              auVar45._12_4_ = 0xffffffff;
              auVar45 = auVar34 ^ auVar45;
              uVar22 = movmskps((int)p_Var25,auVar34);
              pRVar26 = (RTCRayN *)(ulong)(uVar22 ^ 0xf);
              context = local_198;
              if ((uVar22 ^ 0xf) != 0) {
                uVar22 = *(uint *)(args.hit + 4);
                uVar37 = *(uint *)(args.hit + 8);
                uVar39 = *(uint *)(args.hit + 0xc);
                *(uint *)(args.ray + 0xc0) =
                     ~auVar34._0_4_ & *(uint *)args.hit | *(uint *)(args.ray + 0xc0) & auVar34._0_4_
                ;
                *(uint *)(args.ray + 0xc4) =
                     ~auVar34._4_4_ & uVar22 | *(uint *)(args.ray + 0xc4) & auVar34._4_4_;
                *(uint *)(args.ray + 200) =
                     ~auVar34._8_4_ & uVar37 | *(uint *)(args.ray + 200) & auVar34._8_4_;
                *(uint *)(args.ray + 0xcc) =
                     ~auVar34._12_4_ & uVar39 | *(uint *)(args.ray + 0xcc) & auVar34._12_4_;
                uVar22 = *(uint *)(args.hit + 0x14);
                uVar37 = *(uint *)(args.hit + 0x18);
                uVar39 = *(uint *)(args.hit + 0x1c);
                *(uint *)(args.ray + 0xd0) =
                     ~auVar34._0_4_ & *(uint *)(args.hit + 0x10) |
                     *(uint *)(args.ray + 0xd0) & auVar34._0_4_;
                *(uint *)(args.ray + 0xd4) =
                     ~auVar34._4_4_ & uVar22 | *(uint *)(args.ray + 0xd4) & auVar34._4_4_;
                *(uint *)(args.ray + 0xd8) =
                     ~auVar34._8_4_ & uVar37 | *(uint *)(args.ray + 0xd8) & auVar34._8_4_;
                *(uint *)(args.ray + 0xdc) =
                     ~auVar34._12_4_ & uVar39 | *(uint *)(args.ray + 0xdc) & auVar34._12_4_;
                *(undefined1 (*) [16])(args.ray + 0xe0) =
                     ~auVar34 & *(undefined1 (*) [16])(args.hit + 0x20) |
                     *(undefined1 (*) [16])(args.ray + 0xe0) & auVar34;
                *(undefined1 (*) [16])(args.ray + 0xf0) =
                     ~auVar34 & *(undefined1 (*) [16])(args.hit + 0x30) |
                     *(undefined1 (*) [16])(args.ray + 0xf0) & auVar34;
                uVar22 = *(uint *)(args.hit + 0x44);
                uVar37 = *(uint *)(args.hit + 0x48);
                uVar39 = *(uint *)(args.hit + 0x4c);
                *(uint *)(args.ray + 0x100) =
                     ~auVar34._0_4_ & *(uint *)(args.hit + 0x40) |
                     *(uint *)(args.ray + 0x100) & auVar34._0_4_;
                *(uint *)(args.ray + 0x104) =
                     ~auVar34._4_4_ & uVar22 | *(uint *)(args.ray + 0x104) & auVar34._4_4_;
                *(uint *)(args.ray + 0x108) =
                     ~auVar34._8_4_ & uVar37 | *(uint *)(args.ray + 0x108) & auVar34._8_4_;
                *(uint *)(args.ray + 0x10c) =
                     ~auVar34._12_4_ & uVar39 | *(uint *)(args.ray + 0x10c) & auVar34._12_4_;
                uVar22 = *(uint *)(args.hit + 0x54);
                uVar37 = *(uint *)(args.hit + 0x58);
                uVar39 = *(uint *)(args.hit + 0x5c);
                *(uint *)(args.ray + 0x110) =
                     *(uint *)(args.ray + 0x110) & auVar34._0_4_ |
                     ~auVar34._0_4_ & *(uint *)(args.hit + 0x50);
                *(uint *)(args.ray + 0x114) =
                     *(uint *)(args.ray + 0x114) & auVar34._4_4_ | ~auVar34._4_4_ & uVar22;
                *(uint *)(args.ray + 0x118) =
                     *(uint *)(args.ray + 0x118) & auVar34._8_4_ | ~auVar34._8_4_ & uVar37;
                *(uint *)(args.ray + 0x11c) =
                     *(uint *)(args.ray + 0x11c) & auVar34._12_4_ | ~auVar34._12_4_ & uVar39;
                uVar22 = *(uint *)(args.hit + 100);
                uVar37 = *(uint *)(args.hit + 0x68);
                uVar39 = *(uint *)(args.hit + 0x6c);
                *(uint *)(args.ray + 0x120) =
                     *(uint *)(args.ray + 0x120) & auVar34._0_4_ |
                     ~auVar34._0_4_ & *(uint *)(args.hit + 0x60);
                *(uint *)(args.ray + 0x124) =
                     *(uint *)(args.ray + 0x124) & auVar34._4_4_ | ~auVar34._4_4_ & uVar22;
                *(uint *)(args.ray + 0x128) =
                     *(uint *)(args.ray + 0x128) & auVar34._8_4_ | ~auVar34._8_4_ & uVar37;
                *(uint *)(args.ray + 300) =
                     *(uint *)(args.ray + 300) & auVar34._12_4_ | ~auVar34._12_4_ & uVar39;
                uVar22 = *(uint *)(args.hit + 0x74);
                uVar37 = *(uint *)(args.hit + 0x78);
                uVar39 = *(uint *)(args.hit + 0x7c);
                *(uint *)(args.ray + 0x130) =
                     ~auVar34._0_4_ & *(uint *)(args.hit + 0x70) |
                     *(uint *)(args.ray + 0x130) & auVar34._0_4_;
                *(uint *)(args.ray + 0x134) =
                     ~auVar34._4_4_ & uVar22 | *(uint *)(args.ray + 0x134) & auVar34._4_4_;
                *(uint *)(args.ray + 0x138) =
                     ~auVar34._8_4_ & uVar37 | *(uint *)(args.ray + 0x138) & auVar34._8_4_;
                *(uint *)(args.ray + 0x13c) =
                     ~auVar34._12_4_ & uVar39 | *(uint *)(args.ray + 0x13c) & auVar34._12_4_;
                *(undefined1 (*) [16])(args.ray + 0x140) =
                     ~auVar34 & *(undefined1 (*) [16])(args.hit + 0x80) |
                     *(undefined1 (*) [16])(args.ray + 0x140) & auVar34;
                pRVar26 = args.ray;
              }
            }
            auVar49._0_4_ = auVar45._0_4_ << 0x1f;
            auVar49._4_4_ = auVar45._4_4_ << 0x1f;
            auVar49._8_4_ = auVar45._8_4_ << 0x1f;
            auVar49._12_4_ = auVar45._12_4_ << 0x1f;
            iVar21 = movmskps((int)pRVar26,auVar49);
            uVar24 = CONCAT44((int)((ulong)pRVar26 >> 0x20),iVar21);
            if (iVar21 == 0) {
              *(float *)(ray + k * 4 + 0x80) = fVar76;
            }
            else {
              fVar76 = *(float *)(ray + k * 4 + 0x80);
            }
            valid.field_0.v[lVar27] = 0.0;
            valid.field_0.i[0] = -(uint)(fVar77 <= fVar76) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fVar79 <= fVar76) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fVar80 <= fVar76) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fVar81 <= fVar76) & valid.field_0.i[3];
          }
          iVar21 = movmskps((int)uVar24,(undefined1  [16])valid.field_0);
          if (iVar21 == 0) {
            return;
          }
          uVar22 = valid.field_0._0_4_;
          uVar37 = valid.field_0._4_4_;
          uVar39 = valid.field_0._8_4_;
          uVar41 = valid.field_0._12_4_;
          auVar46._0_4_ = uVar22 & (uint)fVar77;
          auVar46._4_4_ = uVar37 & (uint)fVar79;
          auVar46._8_4_ = uVar39 & (uint)fVar80;
          auVar46._12_4_ = uVar41 & (uint)fVar81;
          auVar55._0_8_ = CONCAT44(~uVar37,~uVar22) & 0x7f8000007f800000;
          auVar55._8_4_ = ~uVar39 & 0x7f800000;
          auVar55._12_4_ = ~uVar41 & 0x7f800000;
          auVar55 = auVar55 | auVar46;
          auVar60._4_4_ = auVar55._0_4_;
          auVar60._0_4_ = auVar55._4_4_;
          auVar60._8_4_ = auVar55._12_4_;
          auVar60._12_4_ = auVar55._8_4_;
          auVar78 = minps(auVar60,auVar55);
          auVar47._0_8_ = auVar78._8_8_;
          auVar47._8_4_ = auVar78._0_4_;
          auVar47._12_4_ = auVar78._4_4_;
          auVar78 = minps(auVar47,auVar78);
          auVar48._0_8_ =
               CONCAT44(-(uint)(auVar78._4_4_ == auVar55._4_4_) & uVar37,
                        -(uint)(auVar78._0_4_ == auVar55._0_4_) & uVar22);
          auVar48._8_4_ = -(uint)(auVar78._8_4_ == auVar55._8_4_) & uVar39;
          auVar48._12_4_ = -(uint)(auVar78._12_4_ == auVar55._12_4_) & uVar41;
          iVar21 = movmskps(iVar21,auVar48);
          aVar35 = valid.field_0;
          if (iVar21 != 0) {
            aVar35.i[2] = auVar48._8_4_;
            aVar35._0_8_ = auVar48._0_8_;
            aVar35.i[3] = auVar48._12_4_;
          }
          uVar23 = movmskps(iVar21,(undefined1  [16])aVar35);
          uVar24 = CONCAT44((int)(uVar24 >> 0x20),uVar23);
          lVar27 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }